

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtentBuilder.h
# Opt level: O0

void Parfait::ExtentBuilder::expandExtentWithAnother<double>(Extent<double> *e1,Extent<double> *e2)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  int local_1c;
  int i;
  Extent<double> *e2_local;
  Extent<double> *e1_local;
  
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    pdVar2 = Point<double>::operator[](&e1->lo,local_1c);
    pdVar3 = Point<double>::operator[](&e2->lo,local_1c);
    pdVar2 = std::min<double>(pdVar2,pdVar3);
    dVar1 = *pdVar2;
    pdVar2 = Point<double>::operator[](&e1->lo,local_1c);
    *pdVar2 = dVar1;
    pdVar2 = Point<double>::operator[](&e1->hi,local_1c);
    pdVar3 = Point<double>::operator[](&e2->hi,local_1c);
    pdVar2 = std::max<double>(pdVar2,pdVar3);
    dVar1 = *pdVar2;
    pdVar2 = Point<double>::operator[](&e1->hi,local_1c);
    *pdVar2 = dVar1;
  }
  return;
}

Assistant:

void expandExtentWithAnother(Extent<T>& e1,const Extent<T>& e2){
            for(int i=0;i<3;i++){
                e1.lo[i] = std::min(e1.lo[i],e2.lo[i]);
                e1.hi[i] = std::max(e1.hi[i],e2.hi[i]);
            }
        }